

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively(QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *in_RDI;
  QGraphicsItemPrivate *itemPrivate;
  QGraphicsItemPrivate *in_stack_ffffffffffffffe8;
  InvalidateReason reason;
  
  do {
    reason = (InvalidateReason)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
    if ((in_RDI->graphicsEffect != (QGraphicsEffect *)0x0) &&
       (*(uint *)&in_RDI->field_0x168 = *(uint *)&in_RDI->field_0x168 & 0xfffffffe | 1,
       (*(uint *)&in_RDI->field_0x168 >> 6 & 1) == 0)) {
      QGraphicsEffect::d_func((QGraphicsEffect *)0x97b494);
      QGraphicsEffectSource::d_func((QGraphicsEffectSource *)0x97b49d);
      QGraphicsEffectSourcePrivate::invalidateCache((QGraphicsEffectSourcePrivate *)in_RDI,reason);
    }
    if (in_RDI->parent == (QGraphicsItem *)0x0) {
      in_stack_ffffffffffffffe8 = (QGraphicsItemPrivate *)0x0;
    }
    else {
      in_stack_ffffffffffffffe8 =
           QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                     (&in_RDI->parent->d_ptr);
    }
    in_RDI = in_stack_ffffffffffffffe8;
  } while (in_stack_ffffffffffffffe8 != (QGraphicsItemPrivate *)0x0);
  return;
}

Assistant:

void QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively()
{
    QGraphicsItemPrivate *itemPrivate = this;
    do {
        if (itemPrivate->graphicsEffect) {
            itemPrivate->notifyInvalidated = 1;

            if (!itemPrivate->updateDueToGraphicsEffect)
                static_cast<QGraphicsItemEffectSourcePrivate *>(itemPrivate->graphicsEffect->d_func()->source->d_func())->invalidateCache();
        }
    } while ((itemPrivate = itemPrivate->parent ? itemPrivate->parent->d_ptr.data() : nullptr));
}